

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.cpp
# Opt level: O3

void __thiscall Potassco::SmodelsConvert::SmData::~SmData(SmData *this)

{
  pointer pSVar1;
  pointer pHVar2;
  pointer puVar3;
  pointer pWVar4;
  pointer piVar5;
  pointer pAVar6;
  _Hash_node_base *p_Var7;
  
  flushStep(this);
  for (p_Var7 = (this->symTab_)._M_h._M_before_begin._M_nxt; p_Var7 != (_Hash_node_base *)0x0;
      p_Var7 = p_Var7->_M_nxt) {
    if (p_Var7[2]._M_nxt != (_Hash_node_base *)0x0) {
      operator_delete__(p_Var7[2]._M_nxt);
    }
  }
  pSVar1 = (this->output_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pSVar1 != (pointer)0x0) {
    operator_delete(pSVar1,(long)(this->output_).
                                 super__Vector_base<Potassco::SmodelsConvert::SmData::Symbol,_std::allocator<Potassco::SmodelsConvert::SmData::Symbol>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar1);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_char_*>,_std::allocator<std::pair<const_unsigned_int,_const_char_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&(this->symTab_)._M_h);
  pHVar2 = (this->heuristic_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Heuristic,_std::allocator<Potassco::SmodelsConvert::SmData::Heuristic>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pHVar2 != (pointer)0x0) {
    operator_delete(pHVar2,(long)(this->heuristic_).
                                 super__Vector_base<Potassco::SmodelsConvert::SmData::Heuristic,_std::allocator<Potassco::SmodelsConvert::SmData::Heuristic>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pHVar2);
  }
  puVar3 = (this->extern_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->extern_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  pWVar4 = (this->wlits_).
           super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (pWVar4 != (pointer)0x0) {
    operator_delete(pWVar4,(long)(this->wlits_).
                                 super__Vector_base<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pWVar4);
  }
  piVar5 = (this->lits_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar5 != (pointer)0x0) {
    operator_delete(piVar5,(long)(this->lits_).super__Vector_base<int,_std::allocator<int>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage - (long)piVar5);
  }
  puVar3 = (this->head_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar3 != (pointer)0x0) {
    operator_delete(puVar3,(long)(this->head_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)puVar3);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<Potassco::WeightLit_t,_std::allocator<Potassco::WeightLit_t>_>_>_>_>
  ::~_Rb_tree(&(this->minimize_)._M_t);
  pAVar6 = (this->atoms_).
           super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pAVar6 != (pointer)0x0) {
    operator_delete(pAVar6,(long)(this->atoms_).
                                 super__Vector_base<Potassco::SmodelsConvert::SmData::Atom,_std::allocator<Potassco::SmodelsConvert::SmData::Atom>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pAVar6);
    return;
  }
  return;
}

Assistant:

~SmData() {
		flushStep();
		for (SymTab::iterator it = symTab_.begin(), end = symTab_.end(); it != end; ++it) {
			delete [] it->second;
		}
	}